

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::AssignParamSlotsRegister(ByteCodeGenerator *this)

{
  Type pFVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  Type *ppFVar5;
  undefined4 *puVar6;
  
  ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar1 = *ppFVar5;
  if (pFVar1->paramSlotsRegister != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x3b5,"(top->paramSlotsRegister == Js::Constants::NoRegister)",
                       "top->paramSlotsRegister == Js::Constants::NoRegister");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  RVar4 = NextVarRegister(this);
  pFVar1->paramSlotsRegister = RVar4;
  return;
}

Assistant:

void ByteCodeGenerator::AssignParamSlotsRegister()
{
    FuncInfo* top = funcInfoStack->Top();
    Assert(top->paramSlotsRegister == Js::Constants::NoRegister);
    top->paramSlotsRegister = NextVarRegister();
}